

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O2

LOs __thiscall Omega_h::collect_marked(Omega_h *this,Read<signed_char> *marks)

{
  Alloc *pAVar1;
  int size_in;
  void *extraout_RDX;
  ulong uVar2;
  uint uVar3;
  LOs LVar4;
  ScopedTimer omega_h_scoped_function_timer;
  ScopedTimer omega_h_scoped_function_timer_1;
  allocator local_131;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  Write<int> local_110;
  Write<int> marked;
  LOs offsets;
  type f;
  Write<int> local_b0;
  Write<signed_char> local_a0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  std::__cxx11::string::string
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
             ,(allocator *)&local_50);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,&local_70,
                 ":");
  std::__cxx11::to_string(&local_90,0xaf);
  std::operator+(&local_130,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                 &local_90);
  begin_code("collect_marked",local_130._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&f);
  std::__cxx11::string::~string((string *)&local_70);
  pAVar1 = (marks->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar3 = (uint)pAVar1->size;
  }
  else {
    uVar3 = (uint)((ulong)pAVar1 >> 3);
  }
  Write<signed_char>::Write(&local_a0,&marks->write_);
  std::__cxx11::string::string((string *)&local_130,"",(allocator *)&f);
  offset_scan<signed_char>((Omega_h *)&offsets,(Read<signed_char> *)&local_a0,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  Write<signed_char>::~Write(&local_a0);
  size_in = Read<int>::last((Read<signed_char> *)&offsets);
  std::__cxx11::string::string((string *)&local_130,"",(allocator *)&f);
  Write<int>::Write(&marked,size_in,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  Write<signed_char>::Write((Write<signed_char> *)&f,&marks->write_);
  Write<int>::Write(&f.marked,&marked);
  Write<int>::Write(&f.offsets.write_,&offsets.write_);
  std::__cxx11::string::string
            ((string *)&local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
             ,&local_131);
  std::operator+(&local_70,&local_90,":");
  std::__cxx11::to_string(&local_50,0x54);
  std::operator+(&local_130,&local_70,&local_50);
  begin_code("parallel_for",local_130._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  if (0 < (int)uVar3) {
    entering_parallel = 1;
    Write<signed_char>::Write((Write<signed_char> *)&local_130,(Write<signed_char> *)&f);
    Write<int>::Write((Write<int> *)&local_130.field_2,&f.marked);
    Write<int>::Write(&local_110,&f.offsets.write_);
    entering_parallel = 0;
    for (uVar2 = 0; (uVar3 & 0x7fffffff) != uVar2; uVar2 = uVar2 + 1) {
      if (*(char *)(local_130._M_string_length + uVar2) != '\0') {
        *(int *)(local_130.field_2._8_8_ +
                (long)*(int *)((long)local_110.shared_alloc_.direct_ptr + uVar2 * 4) * 4) =
             (int)uVar2;
      }
    }
    collect_marked(Omega_h::Read<signed_char>)::$_0::~__0((__0 *)&local_130);
  }
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer_1);
  Write<int>::Write(&local_b0,&marked);
  Read<int>::Read((Read<signed_char> *)this,&local_b0);
  Write<int>::~Write(&local_b0);
  collect_marked(Omega_h::Read<signed_char>)::$_0::~__0((__0 *)&f);
  Write<int>::~Write(&marked);
  Write<int>::~Write(&offsets.write_);
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
  LVar4.write_.shared_alloc_.direct_ptr = extraout_RDX;
  LVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar4.write_.shared_alloc_;
}

Assistant:

LOs collect_marked(Read<I8> marks) {
  OMEGA_H_TIME_FUNCTION;
  auto ntotal = marks.size();
  auto offsets = offset_scan(marks);
  auto nmarked = offsets.last();
  Write<LO> marked(nmarked);
  auto f = OMEGA_H_LAMBDA(LO i) {
    if (marks[i]) marked[offsets[i]] = i;
  };
  parallel_for(ntotal, std::move(f));
  return marked;
}